

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

void __thiscall
wabt::BinaryReaderLogging::LogTypes(BinaryReaderLogging *this,Index type_count,Type *types)

{
  uint local_24;
  Index i;
  Type *types_local;
  Index type_count_local;
  BinaryReaderLogging *this_local;
  
  Stream::Writef(this->stream_,"[");
  for (local_24 = 0; local_24 < type_count; local_24 = local_24 + 1) {
    LogType(this,types[local_24]);
    if (local_24 != type_count - 1) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"]");
  return;
}

Assistant:

void BinaryReaderLogging::LogTypes(Index type_count, Type* types) {
  LOGF_NOINDENT("[");
  for (Index i = 0; i < type_count; ++i) {
    LogType(types[i]);
    if (i != type_count - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("]");
}